

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::LinearQuantizationParams::SerializeWithCachedSizes
          (LinearQuantizationParams *this,CodedOutputStream *output)

{
  Rep *pRVar1;
  float *pfVar2;
  
  if (0 < (this->scale_).current_size_) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,10);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_scale_cached_byte_size_);
    pRVar1 = (this->scale_).rep_;
    pfVar2 = pRVar1->elements;
    if (pRVar1 == (Rep *)0x0) {
      pfVar2 = (float *)0x0;
    }
    google::protobuf::internal::WireFormatLite::WriteFloatArray
              (pfVar2,(this->scale_).current_size_,output);
  }
  if (0 < (this->bias_).current_size_) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,0x12);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_bias_cached_byte_size_);
    pRVar1 = (this->bias_).rep_;
    pfVar2 = pRVar1->elements;
    if (pRVar1 == (Rep *)0x0) {
      pfVar2 = (float *)0x0;
    }
    google::protobuf::internal::WireFormatLite::WriteFloatArray
              (pfVar2,(this->bias_).current_size_,output);
    return;
  }
  return;
}

Assistant:

void LinearQuantizationParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.LinearQuantizationParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated float scale = 1;
  if (this->scale_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_scale_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteFloatArray(
      this->scale().data(), this->scale_size(), output);
  }

  // repeated float bias = 2;
  if (this->bias_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(2, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_bias_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteFloatArray(
      this->bias().data(), this->bias_size(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.LinearQuantizationParams)
}